

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O0

void test_bson_utf8_escape_for_json(void)

{
  int iVar1;
  void *pvVar2;
  char *unescaped;
  char *str;
  
  pvVar2 = (void *)bson_utf8_escape_for_json("my",6);
  iVar1 = memcmp(pvVar2,"my\\u0000key",7);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x34,"test_bson_utf8_escape_for_json","0 == memcmp (str, \"my\\\\u0000key\", 7)");
    abort();
  }
  bson_free(pvVar2);
  pvVar2 = (void *)bson_utf8_escape_for_json("my\"key",6);
  iVar1 = memcmp(pvVar2,"my\\\"key",8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x38,"test_bson_utf8_escape_for_json","0 == memcmp (str, \"my\\\\\\\"key\", 8)");
    abort();
  }
  bson_free(pvVar2);
  pvVar2 = (void *)bson_utf8_escape_for_json("my\\key",6);
  iVar1 = memcmp(pvVar2,"my\\\\key",8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x3c,"test_bson_utf8_escape_for_json","0 == memcmp (str, \"my\\\\\\\\key\", 8)");
    abort();
  }
  bson_free(pvVar2);
  pvVar2 = (void *)bson_utf8_escape_for_json("\\\"\\\"",0xffffffffffffffff);
  iVar1 = memcmp(pvVar2,"\\\\\\\"\\\\\\\"",9);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x40,"test_bson_utf8_escape_for_json",
            "0 == memcmp (str, \"\\\\\\\\\\\\\\\"\\\\\\\\\\\\\\\"\", 9)");
    abort();
  }
  bson_free(pvVar2);
  pvVar2 = (void *)bson_utf8_escape_for_json("\x0e",0xffffffffffffffff);
  iVar1 = memcmp(pvVar2,"\\u000e",7);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x44,"test_bson_utf8_escape_for_json","0 == memcmp (str, \"\\\\u000e\", 7)");
    abort();
  }
  bson_free(pvVar2);
  return;
}

Assistant:

static void
test_bson_utf8_escape_for_json (void)
{
   char *str;
   char *unescaped = "\x0e";

   str = bson_utf8_escape_for_json ("my\0key", 6);
   BSON_ASSERT (0 == memcmp (str, "my\\u0000key", 7));
   bson_free (str);

   str = bson_utf8_escape_for_json ("my\"key", 6);
   BSON_ASSERT (0 == memcmp (str, "my\\\"key", 8));
   bson_free (str);

   str = bson_utf8_escape_for_json ("my\\key", 6);
   BSON_ASSERT (0 == memcmp (str, "my\\\\key", 8));
   bson_free (str);

   str = bson_utf8_escape_for_json ("\\\"\\\"", -1);
   BSON_ASSERT (0 == memcmp (str, "\\\\\\\"\\\\\\\"", 9));
   bson_free (str);

   str = bson_utf8_escape_for_json (unescaped, -1);
   BSON_ASSERT (0 == memcmp (str, "\\u000e", 7));
   bson_free (str);
}